

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexture.cpp
# Opt level: O1

ostream * tcu::operator<<(ostream *str,ChannelOrder order)

{
  char *__s;
  size_t sVar1;
  
  __s = *(char **)(&DAT_007a0be0 + (long)(int)order * 8);
  sVar1 = strlen(__s);
  std::__ostream_insert<char,std::char_traits<char>>(str,__s,sVar1);
  return str;
}

Assistant:

std::ostream& operator<< (std::ostream& str, TextureFormat::ChannelOrder order)
{
	const char* const orderStrings[] =
	{
		"R",
		"A",
		"I",
		"L",
		"LA",
		"RG",
		"RA",
		"RGB",
		"RGBA",
		"ARGB",
		"BGR",
		"BGRA",

		"sR",
		"sRG",
		"sRGB",
		"sRGBA",
		"sBGR",
		"sBGRA",

		"D",
		"S",
		"DS"
	};

	return str << de::getSizedArrayElement<TextureFormat::CHANNELORDER_LAST>(orderStrings, order);
}